

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::setLoggingCallback
          (CoreBroker *this,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *logFunction)

{
  atomic<unsigned_short> *paVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  ActionMessage loggerUpdate;
  ActionMessage AStack_d8;
  
  ActionMessage::ActionMessage(&AStack_d8,cmd_broker_configure);
  AStack_d8.messageID = 0x250;
  AStack_d8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  if ((logFunction->super__Function_base)._M_manager == (_Manager_type)0x0) {
    AStack_d8.flags._1_1_ = AStack_d8.flags._1_1_ | 0x80;
  }
  else {
    LOCK();
    paVar1 = &this->nextAirLock;
    uVar2 = (paVar1->super___atomic_base<unsigned_short>)._M_i;
    (paVar1->super___atomic_base<unsigned_short>)._M_i =
         (paVar1->super___atomic_base<unsigned_short>)._M_i + 1;
    UNLOCK();
    uVar5 = uVar2 & 1;
    if (uVar2 < 3) {
      uVar5 = uVar2;
    }
    if (uVar5 == 2) {
      uVar4 = 3;
      do {
        uVar3 = (ushort)uVar4;
        LOCK();
        uVar2 = (this->nextAirLock).super___atomic_base<unsigned_short>._M_i;
        if (uVar3 == uVar2) {
          (this->nextAirLock).super___atomic_base<unsigned_short>._M_i =
               uVar3 + (short)(uVar4 / 3) * -3;
        }
        else {
          uVar4 = (uint)uVar2;
        }
        UNLOCK();
      } while ((uVar3 != uVar2) && (2 < (ushort)uVar4));
    }
    gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
    load<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
              ((AirLock<std::any,std::mutex,std::condition_variable> *)
               ((this->dataAirlocks)._M_elems + uVar5),
               (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)logFunction);
    AStack_d8.counter = uVar5;
  }
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
             &(this->super_BrokerBase).actionQueue,&AStack_d8);
  ActionMessage::~ActionMessage(&AStack_d8);
  return;
}

Assistant:

void CoreBroker::setLoggingCallback(
    std::function<void(int, std::string_view, std::string_view)> logFunction)
{
    ActionMessage loggerUpdate(CMD_BROKER_CONFIGURE);
    loggerUpdate.messageID = UPDATE_LOGGING_CALLBACK;
    loggerUpdate.source_id = global_id.load();
    if (logFunction) {
        auto index = getNextAirlockIndex();
        dataAirlocks[index].load(std::move(logFunction));
        loggerUpdate.counter = index;
    } else {
        setActionFlag(loggerUpdate, empty_flag);
    }

    actionQueue.push(loggerUpdate);
}